

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
Kraken::sha256(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
              string *data)

{
  void *data_00;
  size_t len;
  uchar *md;
  undefined1 local_9c [8];
  SHA256_CTX ctx;
  allocator<unsigned_char> local_1a;
  undefined1 local_19;
  string *local_18;
  string *data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *digest;
  
  local_19 = 0;
  local_18 = data;
  data_local = (string *)__return_storage_ptr__;
  std::allocator<unsigned_char>::allocator(&local_1a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,0x20,&local_1a);
  std::allocator<unsigned_char>::~allocator(&local_1a);
  SHA256_Init((SHA256_CTX *)local_9c);
  data_00 = (void *)std::__cxx11::string::c_str();
  len = std::__cxx11::string::length();
  SHA256_Update((SHA256_CTX *)local_9c,data_00,len);
  md = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(__return_storage_ptr__);
  SHA256_Final(md,(SHA256_CTX *)local_9c);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<unsigned char> sha256(const std::string& data)
{
   std::vector<unsigned char> digest(SHA256_DIGEST_LENGTH);

   SHA256_CTX ctx;
   SHA256_Init(&ctx);
   SHA256_Update(&ctx, data.c_str(), data.length());
   SHA256_Final(digest.data(), &ctx);

   return digest;
}